

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

VP8StatusCode DecodeInto(uint8_t *data,size_t data_size,WebPDecParams *params)

{
  VP8StatusCode VVar1;
  int iVar2;
  VP8Decoder *dec;
  WebPHeaderStructure headers;
  VP8Io io;
  WebPHeaderStructure local_108;
  VP8Io local_c0;
  
  local_108.have_all_data = 1;
  local_108.data = data;
  local_108.data_size = data_size;
  VVar1 = WebPParseHeaders(&local_108);
  if (VVar1 != VP8_STATUS_OK) {
    return VVar1;
  }
  VP8InitIoInternal(&local_c0,0x209);
  local_c0.data = local_108.data + local_108.offset;
  local_c0.data_size = local_108.data_size - local_108.offset;
  WebPInitCustomIo(params,&local_c0);
  if (local_108.is_lossless == 0) {
    dec = VP8New();
    if (dec != (VP8Decoder *)0x0) {
      dec->alpha_data_ = local_108.alpha_data;
      dec->alpha_data_size_ = local_108.alpha_data_size;
      iVar2 = VP8GetHeaders(dec,&local_c0);
      if (iVar2 == 0) {
LAB_00104a53:
        VVar1 = dec->status_;
      }
      else {
        VVar1 = WebPAllocateDecBuffer(local_c0.width,local_c0.height,params->options,params->output)
        ;
        if (VVar1 == VP8_STATUS_OK) {
          iVar2 = VP8GetThreadMethod(params->options,&local_108,local_c0.width,local_c0.height);
          dec->mt_method_ = iVar2;
          VP8InitDithering(params->options,dec);
          iVar2 = VP8Decode(dec,&local_c0);
          VVar1 = VP8_STATUS_OK;
          if (iVar2 == 0) goto LAB_00104a53;
        }
      }
      VP8Delete(dec);
      goto LAB_00104a62;
    }
  }
  else {
    dec = (VP8Decoder *)VP8LNew();
    if (dec != (VP8Decoder *)0x0) {
      iVar2 = VP8LDecodeHeader((VP8LDecoder *)dec,&local_c0);
      if (iVar2 == 0) {
LAB_001049b3:
        VVar1 = dec->status_;
      }
      else {
        VVar1 = WebPAllocateDecBuffer(local_c0.width,local_c0.height,params->options,params->output)
        ;
        if (VVar1 == VP8_STATUS_OK) {
          iVar2 = VP8LDecodeImage((VP8LDecoder *)dec);
          VVar1 = VP8_STATUS_OK;
          if (iVar2 == 0) goto LAB_001049b3;
        }
      }
      VP8LDelete((VP8LDecoder *)dec);
      goto LAB_00104a62;
    }
  }
  VVar1 = VP8_STATUS_OK;
LAB_00104a62:
  if (dec == (VP8Decoder *)0x0) {
    VVar1 = VP8_STATUS_OUT_OF_MEMORY;
  }
  else if (VVar1 == VP8_STATUS_OK) {
    VVar1 = VP8_STATUS_OK;
    if ((params->options != (WebPDecoderOptions *)0x0) && (params->options->flip != 0)) {
      VVar1 = WebPFlipBuffer(params->output);
    }
  }
  else {
    WebPFreeDecBuffer(params->output);
  }
  return VVar1;
}

Assistant:

static VP8StatusCode DecodeInto(const uint8_t* const data, size_t data_size,
                                WebPDecParams* const params) {
  VP8StatusCode status;
  VP8Io io;
  WebPHeaderStructure headers;

  headers.data = data;
  headers.data_size = data_size;
  headers.have_all_data = 1;
  status = WebPParseHeaders(&headers);   // Process Pre-VP8 chunks.
  if (status != VP8_STATUS_OK) {
    return status;
  }

  assert(params != NULL);
  VP8InitIo(&io);
  io.data = headers.data + headers.offset;
  io.data_size = headers.data_size - headers.offset;
  WebPInitCustomIo(params, &io);  // Plug the I/O functions.

  if (!headers.is_lossless) {
    VP8Decoder* const dec = VP8New();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    dec->alpha_data_ = headers.alpha_data;
    dec->alpha_data_size_ = headers.alpha_data_size;

    // Decode bitstream header, update io->width/io->height.
    if (!VP8GetHeaders(dec, &io)) {
      status = dec->status_;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        // This change must be done before calling VP8Decode()
        dec->mt_method_ = VP8GetThreadMethod(params->options, &headers,
                                             io.width, io.height);
        VP8InitDithering(params->options, dec);
        if (!VP8Decode(dec, &io)) {
          status = dec->status_;
        }
      }
    }
    VP8Delete(dec);
  } else {
    VP8LDecoder* const dec = VP8LNew();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    if (!VP8LDecodeHeader(dec, &io)) {
      status = dec->status_;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        if (!VP8LDecodeImage(dec)) {
          status = dec->status_;
        }
      }
    }
    VP8LDelete(dec);
  }

  if (status != VP8_STATUS_OK) {
    WebPFreeDecBuffer(params->output);
  } else {
    if (params->options != NULL && params->options->flip) {
      // This restores the original stride values if options->flip was used
      // during the call to WebPAllocateDecBuffer above.
      status = WebPFlipBuffer(params->output);
    }
  }
  return status;
}